

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

int Ssw_ClassesRefineConst1(Ssw_Cla_t *p,int fRecursive)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t **ppAVar5;
  int iVar6;
  Aig_Man_t *pAVar7;
  void **ppvVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  Aig_Obj_t *pAVar11;
  long lVar12;
  
  p->vClassNew->nSize = 0;
  pAVar7 = p->pAig;
  pVVar9 = pAVar7->vObjs;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      if (pAVar7->pReprs[lVar12] == pAVar7->pConst1) {
        pAVar2 = (Aig_Obj_t *)pVVar9->pArray[lVar12];
        iVar6 = (*p->pFuncNodeIsConst)(p->pManData,pAVar2);
        if (iVar6 == 0) {
          pVVar9 = p->vClassNew;
          uVar1 = pVVar9->nSize;
          if (uVar1 == pVVar9->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar9->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar9->pArray,0x80);
              }
              pVVar9->pArray = ppvVar8;
              pVVar9->nCap = 0x10;
            }
            else {
              if (pVVar9->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar9->pArray,(ulong)uVar1 << 4);
              }
              pVVar9->pArray = ppvVar8;
              pVVar9->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar8 = pVVar9->pArray;
          }
          iVar6 = pVVar9->nSize;
          pVVar9->nSize = iVar6 + 1;
          ppvVar8[iVar6] = pAVar2;
        }
      }
      lVar12 = lVar12 + 1;
      pAVar7 = p->pAig;
      pVVar9 = pAVar7->vObjs;
    } while (lVar12 < pVVar9->nSize);
    pVVar9 = p->vClassNew;
    iVar6 = pVVar9->nSize;
    if (iVar6 != 0) {
      if (p->fConstCorr == 0) {
        p->nCands1 = p->nCands1 - iVar6;
        if (iVar6 < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (pAVar7->pReprs != (Aig_Obj_t **)0x0) {
          pAVar2 = (Aig_Obj_t *)*pVVar9->pArray;
          iVar6 = pAVar2->Id;
          pAVar7->pReprs[iVar6] = (Aig_Obj_t *)0x0;
          pVVar9 = p->vClassNew;
          iVar10 = pVVar9->nSize;
          if ((long)iVar10 == 1) {
            return 1;
          }
          ppAVar3 = p->pMemClassesFree;
          p->pMemClassesFree = ppAVar3 + iVar10;
          if (0 < iVar10) {
            lVar12 = 0;
            do {
              pAVar4 = (Aig_Obj_t *)pVVar9->pArray[lVar12];
              ppAVar3[lVar12] = pAVar4;
              ppAVar5 = p->pAig->pReprs;
              if (ppAVar5 == (Aig_Obj_t **)0x0) goto LAB_005e409b;
              pAVar11 = pAVar2;
              if (lVar12 == 0) {
                pAVar11 = (Aig_Obj_t *)0x0;
              }
              ppAVar5[pAVar4->Id] = pAVar11;
              lVar12 = lVar12 + 1;
              pVVar9 = p->vClassNew;
              iVar10 = pVVar9->nSize;
            } while (lVar12 < iVar10);
          }
          if (p->pId2Class[iVar6] != (Aig_Obj_t **)0x0) {
            __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                          ,0x5e,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)")
            ;
          }
          if (*ppAVar3 != pAVar2) {
            __assert_fail("pClass[0] == pRepr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                          ,0x5f,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)")
            ;
          }
          p->pId2Class[iVar6] = ppAVar3;
          if (p->pClassSizes[iVar6] != 0) {
            __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                          ,0x61,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)")
            ;
          }
          if (1 < iVar10) {
            p->pClassSizes[iVar6] = iVar10;
            p->nClasses = p->nClasses + 1;
            p->nLits = p->nLits + iVar10 + -1;
            if (fRecursive == 0) {
              return 1;
            }
            iVar6 = Ssw_ClassesRefineOneClass(p,pAVar2,1);
            return iVar6 + 1;
          }
          __assert_fail("nSize > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                        ,0x62,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
      }
      else {
        if (iVar6 < 1) {
          return 1;
        }
        lVar12 = 0;
        while (ppAVar3 = p->pAig->pReprs, ppAVar3 != (Aig_Obj_t **)0x0) {
          ppAVar3[*(int *)((long)pVVar9->pArray[lVar12] + 0x24)] = (Aig_Obj_t *)0x0;
          lVar12 = lVar12 + 1;
          pVVar9 = p->vClassNew;
          if (pVVar9->nSize <= lVar12) {
            return 1;
          }
        }
      }
LAB_005e409b:
      __assert_fail("p->pReprs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                    ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  return 0;
}

Assistant:

int Ssw_ClassesRefineConst1( Ssw_Cla_t * p, int fRecursive )
{
    Aig_Obj_t * pObj, * pReprNew, ** ppClassNew;
    int i;
    // collect the nodes to be refined
    Vec_PtrClear( p->vClassNew );
    for ( i = 0; i < Vec_PtrSize(p->pAig->vObjs); i++ )
        if ( p->pAig->pReprs[i] == Aig_ManConst1(p->pAig) )
        {
            pObj = Aig_ManObj( p->pAig, i );
            if ( !p->pFuncNodeIsConst( p->pManData, pObj ) )
            {
                Vec_PtrPush( p->vClassNew, pObj );
//                Vec_PtrPush( p->vRefined, pObj );
            }
        }
    // check if there is a new class
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
    if ( p->fConstCorr )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
            Aig_ObjSetRepr( p->pAig, pObj, NULL );
        return 1;
    }
    p->nCands1 -= Vec_PtrSize(p->vClassNew);
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    Aig_ObjSetRepr( p->pAig, pReprNew, NULL );
    if ( Vec_PtrSize(p->vClassNew) == 1 )
        return 1;
    // create a new class composed of these nodes
    ppClassNew = p->pMemClassesFree;
    p->pMemClassesFree += Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }
    Ssw_ObjAddClass( p, pReprNew, ppClassNew, Vec_PtrSize(p->vClassNew) );
    // refine them recursively
    if ( fRecursive )
        return 1 + Ssw_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}